

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniform
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,Uniform *uniform,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations,
          GLint max)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int iVar1;
  GLuint GVar2;
  pointer puVar3;
  pointer pUVar4;
  LayoutSpecifierBase *pLVar5;
  bool bVar6;
  bool bVar7;
  GLint GVar8;
  GLint GVar9;
  iterator iVar10;
  ulong uVar11;
  long lVar12;
  uint arrayElem;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  char (*t) [5];
  char (*pacVar14) [2];
  char (*t_00) [7];
  char (*t_01) [51];
  char (*t_02) [17];
  byte bVar15;
  size_t i;
  ulong uVar16;
  int local_3f8;
  GLint returned;
  ulong local_3f0;
  GLint local_3e8;
  GLint reservedLocation;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_3e0;
  Uniform *local_3d8;
  ulong local_3d0;
  GLint local_3c8;
  GLint expected;
  GLint returnedPIQ;
  GLint max_local;
  CallLogWrapper *local_3b8;
  LayoutSpecifierBase *local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  _Base_ptr local_388;
  string *local_380;
  DefOccurence *local_378;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_370;
  Logger local_358;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream name;
  
  local_3d8 = uniform;
  max_local = max;
  if ((uniform->type).baseType == 0) {
    lVar12 = 0;
    local_3f0 = 0;
    for (uVar16 = 0;
        pUVar4 = (local_3d8->childUniforms).
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar16 < (ulong)(((long)(local_3d8->childUniforms).
                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4) / 0x1d8);
        uVar16 = uVar16 + 1) {
      uVar11 = runQueryUniform(this,program,(Uniform *)((long)&(pUVar4->type).enumType + lVar12),
                               usedLocations,max);
      local_3f0 = local_3f0 | uVar11;
      lVar12 = lVar12 + 0x1d8;
    }
  }
  else {
    local_3b0 = &(uniform->location).super_LayoutSpecifierBase;
    __x = &program->stages;
    local_380 = (string *)&uniform->name;
    local_3b8 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
    local_378 = &uniform->usageOccurence;
    local_388 = &(usedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_3d0 = 0;
    local_3c8 = max;
    if (max < 1) {
      local_3c8 = 0;
    }
    local_3f0 = 0;
    local_3e0 = &usedLocations->_M_t;
    for (; (int)local_3d0 < (local_3d8->type).arraySize; local_3d0 = (ulong)((int)local_3d0 + 1)) {
      reservedLocation = -1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c0,__x);
      pLVar5 = local_3b0;
      bVar6 = LayoutSpecifierBase::isImplicit
                        (local_3b0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c0
                        );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c0);
      local_3f8 = -1;
      arrayElem = (uint)local_3d0;
      if (!bVar6) {
        local_3f8 = pLVar5->val + arrayElem;
        reservedLocation = local_3f8;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_370,__x);
      bVar6 = LayoutSpecifierBase::isImplicit
                        (pLVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_370);
      if ((arrayElem < 1000) || (bVar6)) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_370);
LAB_00bda1e0:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::operator<<((ostream *)&name,local_380);
        UniformType::streamArrayStr(&local_3d8->type,&name,arrayElem);
        GVar2 = program->name;
        std::__cxx11::stringbuf::str();
        GVar8 = glu::CallLogWrapper::glGetUniformLocation
                          (local_3b8,GVar2,(GLchar *)CONCAT44(local_358._4_4_,local_358._0_4_));
        std::__cxx11::string::~string((string *)&local_358);
        GVar2 = program->name;
        returned = GVar8;
        std::__cxx11::stringbuf::str();
        GVar9 = glu::CallLogWrapper::glGetProgramResourceLocation
                          (local_3b8,GVar2,0x92e1,
                           (GLchar *)CONCAT44(local_358._4_4_,local_358._0_4_));
        std::__cxx11::string::~string((string *)&local_358);
        returnedPIQ = GVar9;
        if (GVar8 != GVar9) {
          Logger::Logger(&local_358);
          if (local_358.null_log_ == false) {
            std::operator<<(&local_358.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                            "Locations of  uniform \"");
          }
          std::__cxx11::stringbuf::str();
          pbVar13 = &local_3a8;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,&local_3a8);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&local_358,(char (*) [84])pbVar13);
          t = (char (*) [5])&returned;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)t);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,t);
          pacVar14 = (char (*) [2])&returnedPIQ;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)pacVar14);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,pacVar14);
          std::__cxx11::string::~string((string *)&local_3a8);
          Logger::~Logger(&local_358);
          local_3f0 = 0xffffffffffffffff;
        }
        pLVar5 = local_3b0;
        bVar15 = 0;
        local_3e8 = GVar8;
        for (uVar16 = 0;
            puVar3 = (program->stages).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar16 < (ulong)((long)(program->stages).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2);
            uVar16 = uVar16 + 1) {
          bVar6 = DefOccurence::occurs(&uniform->declOccurence,puVar3[uVar16]);
          bVar7 = false;
          if (bVar6) {
            bVar7 = DefOccurence::occurs
                              (local_378,
                               (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar16]);
          }
          bVar15 = bVar15 | bVar7;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,__x);
        bVar6 = LayoutSpecifierBase::isImplicit
                          (pLVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8)
        ;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1d8);
        if (bVar6) {
          if (bVar15 == 0) goto LAB_00bda48c;
          if (-1 < local_3e8) {
            reservedLocation = local_3e8;
            local_3f8 = local_3e8;
            goto LAB_00bda48c;
          }
          Logger::Logger(&local_358);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&local_358,(char (*) [21])"Unexpected uniform \"");
          this_00 = local_3e0;
          pbVar13 = &local_3a8;
          std::__cxx11::stringbuf::str();
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,pbVar13);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&local_358,(char (*) [42])pbVar13);
          pacVar14 = (char (*) [2])&returned;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)pacVar14);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,pacVar14);
LAB_00bda524:
          std::__cxx11::string::~string((string *)&local_3a8);
          Logger::~Logger(&local_358);
          local_3f0 = 0xffffffffffffffff;
        }
        else {
          expected = local_3f8;
          if ((local_3f8 != local_3e8) && (local_3e8 != -1 || bVar15 != 0)) {
            Logger::Logger(&local_358);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)&local_358,(char (*) [21])"Unexpected uniform \"");
            std::__cxx11::stringbuf::str();
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,&local_3a8);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)&local_358,(char (*) [22])"\" location: expected ");
            t_00 = (char (*) [7])&expected;
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)t_00);
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,t_00);
            pacVar14 = (char (*) [2])&returned;
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)pacVar14);
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,pacVar14);
            std::__cxx11::string::~string((string *)&local_3a8);
            Logger::~Logger(&local_358);
            local_3f0 = 0xffffffffffffffff;
          }
LAB_00bda48c:
          this_00 = local_3e0;
          if (local_3c8 <= local_3e8) {
            Logger::Logger(&local_358);
            this_00 = local_3e0;
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)&local_358,(char (*) [10])0x18fc95a);
            std::__cxx11::stringbuf::str();
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,&local_3a8);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)&local_358,(char (*) [22])"\" returned location (");
            t_01 = (char (*) [51])&returned;
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)t_01);
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,t_01);
            glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,&max_local);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)&local_358,(char (*) [3])0x18b969b);
            goto LAB_00bda524;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
      else {
        iVar1 = (local_3d8->type).arraySize;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_370);
        this_00 = local_3e0;
        arrayElem = (uint)local_3d0;
        if (iVar1 + -1000 < (int)(uint)local_3d0) goto LAB_00bda1e0;
      }
      if (-1 < local_3f8) {
        local_358._0_4_ = local_3f8;
        iVar10 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(this_00,(key_type *)&local_358);
        if (iVar10._M_node != local_388) {
          Logger::Logger(&local_358);
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&local_358,(char (*) [19])"Uniform location (");
          t_02 = (char (*) [17])&reservedLocation;
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,(int *)t_02);
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&local_358,t_02);
          Logger::~Logger(&local_358);
          local_3f0 = 0xffffffffffffffff;
        }
        local_358._0_4_ = local_3f8;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(this_00,(uint *)&local_358);
      }
    }
  }
  return local_3f0;
}

Assistant:

long runQueryUniform(const CompiledProgram& program, const Uniform& uniform, std::set<GLuint>& usedLocations,
						 GLint max)
	{
		long ret = NO_ERROR;

		/*
		 glGetUniformLocation(program, name);
		 Query passes if returned value is unique in current program, matches
		 explicit location (if passed in GLSL code) and is less than value of
		 GL_MAX_UNIFORM_LOCATIONS.

		 glGetProgramResourceLocation(program, GL_UNIFIORM, name);
		 Query passes if returned value matches value returned from
		 glGetUniformLocation().
		 */

		if (uniform.type.isStruct())
		{
			for (size_t i = 0; i < uniform.childUniforms.size(); i++)
			{
				ret |= runQueryUniform(program, uniform.childUniforms[i], usedLocations, max);
			}
		}
		else
		{
			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{

				/* Location that is taken by this uniform (even if not used).*/
				GLint reservedLocation = -1;
				if (!uniform.location.isImplicit(program.stages))
				{
					reservedLocation = uniform.location.val + arrayElem;
				}

				//optimization: for continuous arrays run queries at the beging and end only.
				bool runQueries = uniform.location.isImplicit(program.stages) ||
								  (arrayElem < 1000 || arrayElem > uniform.type.arraySize - 1000);

				if (runQueries)
				{
					std::ostringstream name;
					name << uniform.getName();
					uniform.type.streamArrayStr(name, arrayElem);
					GLint returned = glGetUniformLocation(program.name, name.str().c_str());

					GLint returnedPIQ = glGetProgramResourceLocation(program.name, GL_UNIFORM, name.str().c_str());

					if (returned != returnedPIQ)
					{
						ret |= ERROR;
						Logger()
							<< "Locations of  uniform \"" << name.str()
							<< "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
							<< returned << " != " << returnedPIQ << ".";
					}

					bool used = false;
					for (size_t i = 0; i < program.stages.size(); i++)
					{
						used |= uniform.declOccurence.occurs(program.stages[i]) &&
								uniform.usageOccurence.occurs(program.stages[i]);
					}

					if (!uniform.location.isImplicit(program.stages))
					{
						//Validate uniform location against explicit value
						GLint expected = reservedLocation;
						if (!(expected == returned || (!used && returned == -1)))
						{
							ret |= ERROR;
							Logger() << "Unexpected uniform \"" << name.str() << "\" location: expected " << expected
									 << ", got " << returned << ".";
						}
					}
					else
					{
						//Check if location > 0 if used;
						if (used)
						{
							if (returned < 0)
							{
								ret |= ERROR;
								Logger() << "Unexpected uniform \"" << name.str()
										 << "\" location: expected positive value, got " << returned << ".";
							}
							else
							{
								reservedLocation = returned;
							}
						}
					}

					if (returned >= 0)
					{
						//check if location is less than max

						if (returned >= max)
						{
							ret |= ERROR;
							Logger() << "Uniform \"" << name.str() << "\" returned location (" << returned
									 << ") is greater than implementation dependent limit (" << max << ").";
						}
					}
				} //if (runQueries)

				//usedLocations is always checked (even if queries were not run.
				if (reservedLocation >= 0)
				{
					//check if location is unique
					if (usedLocations.find(reservedLocation) != usedLocations.end())
					{
						ret |= ERROR;
						Logger() << "Uniform location (" << reservedLocation << ") is not unique.";
					}
					usedLocations.insert(reservedLocation);
				}
			}
		}
		return ret;
	}